

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall
Symbol::SetHasMaybeEscapedUseInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  CharacterBuffer<char16_t> *this_00;
  Scope *this_01;
  char16_t *pcVar5;
  ByteCodeGenerator *byteCodeGenerator_local;
  Symbol *this_local;
  
  if ((this->hasMaybeEscapedUse & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x81,"(!hasMaybeEscapedUse)","!hasMaybeEscapedUse");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = GetIsFormal(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x82,"(!this->GetIsFormal())","!this->GetIsFormal()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->hasMaybeEscapedUse = true;
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar4->byteCodeFunction->super_FunctionProxy);
  pFVar4 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  functionId = Js::FunctionProxy::GetLocalFunctionId(&pFVar4->byteCodeFunction->super_FunctionProxy)
  ;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,StackFuncPhase,sourceContextId,functionId);
  if (bVar2) {
    this_00 = GetName(this);
    pcVar5 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(this_00);
    Output::Print(L"HasMaybeEscapedUse: %s\n",pcVar5);
    Output::Flush();
  }
  bVar2 = GetHasFuncAssignment(this);
  if (bVar2) {
    this_01 = GetScope(this);
    pFVar4 = Scope::GetFunc(this_01);
    pcVar5 = L"MaybeEscapedUse";
    if (this->symbolType == STFunction) {
      pcVar5 = L"MaybeEscapedUseFuncDecl";
    }
    FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar4,pcVar5);
  }
  return;
}

Assistant:

void Symbol::SetHasMaybeEscapedUseInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasMaybeEscapedUse);
    Assert(!this->GetIsFormal());
    hasMaybeEscapedUse = true;
    if (PHASE_TESTTRACE(Js::StackFuncPhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
    {
        Output::Print(_u("HasMaybeEscapedUse: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
    if (this->GetHasFuncAssignment())
    {
        this->GetScope()->GetFunc()->SetHasMaybeEscapedNestedFunc(
            DebugOnly(this->symbolType == STFunction ? _u("MaybeEscapedUseFuncDecl") : _u("MaybeEscapedUse")));
    }
}